

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

u8 * pageFindSlot(MemPage *pPg,int nByte,int *pRc)

{
  u8 *puVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int size;
  int maxPC;
  int x;
  int pc;
  u8 *pTmp;
  int iAddr;
  u8 *aData;
  int hdr;
  int *pRc_local;
  int nByte_local;
  MemPage *pPg_local;
  
  uVar3 = (uint)pPg->hdrOffset;
  puVar1 = pPg->aData;
  pTmp._4_4_ = uVar3 + 1;
  iVar4 = pPg->pBt->usableSize - nByte;
  maxPC = (uint)CONCAT11(puVar1[pTmp._4_4_],(puVar1 + pTmp._4_4_)[1]);
  while( true ) {
    if (iVar4 < maxPC) {
      if (iVar4 + nByte + -4 < maxPC) {
        iVar4 = sqlite3CorruptError(0x1107e);
        *pRc = iVar4;
      }
      return (u8 *)0x0;
    }
    iVar5 = (uint)CONCAT11(puVar1[maxPC + 2],(puVar1 + (maxPC + 2))[1]) - nByte;
    if (-1 < iVar5) break;
    pTmp._4_4_ = maxPC;
    uVar6 = (uint)CONCAT11(puVar1[maxPC],(puVar1 + maxPC)[1]);
    bVar2 = uVar6 <= (uint)maxPC;
    maxPC = uVar6;
    if (bVar2) {
      if (uVar6 != 0) {
        iVar4 = sqlite3CorruptError(0x11077);
        *pRc = iVar4;
      }
      return (u8 *)0x0;
    }
  }
  if (3 < iVar5) {
    if (iVar4 < iVar5 + maxPC) {
      iVar4 = sqlite3CorruptError(0x11068);
      *pRc = iVar4;
      return (u8 *)0x0;
    }
    puVar1[maxPC + 2] = (u8)((uint)iVar5 >> 8);
    puVar1[(long)(maxPC + 2) + 1] = (u8)iVar5;
    return puVar1 + (maxPC + iVar5);
  }
  if (0x39 < puVar1[(int)(uVar3 + 7)]) {
    return (u8 *)0x0;
  }
  *(undefined2 *)(puVar1 + pTmp._4_4_) = *(undefined2 *)(puVar1 + maxPC);
  puVar1[(int)(uVar3 + 7)] = puVar1[(int)(uVar3 + 7)] + (u8)iVar5;
  return puVar1 + maxPC;
}

Assistant:

static u8 *pageFindSlot(MemPage *pPg, int nByte, int *pRc){
  const int hdr = pPg->hdrOffset;            /* Offset to page header */
  u8 * const aData = pPg->aData;             /* Page data */
  int iAddr = hdr + 1;                       /* Address of ptr to pc */
  u8 *pTmp = &aData[iAddr];                  /* Temporary ptr into aData[] */
  int pc = get2byte(pTmp);                   /* Address of a free slot */
  int x;                                     /* Excess size of the slot */
  int maxPC = pPg->pBt->usableSize - nByte;  /* Max address for a usable slot */
  int size;                                  /* Size of the free slot */

  assert( pc>0 );
  while( pc<=maxPC ){
    /* EVIDENCE-OF: R-22710-53328 The third and fourth bytes of each
    ** freeblock form a big-endian integer which is the size of the freeblock
    ** in bytes, including the 4-byte header. */
    pTmp = &aData[pc+2];
    size = get2byte(pTmp);
    if( (x = size - nByte)>=0 ){
      testcase( x==4 );
      testcase( x==3 );
      if( x<4 ){
        /* EVIDENCE-OF: R-11498-58022 In a well-formed b-tree page, the total
        ** number of bytes in fragments may not exceed 60. */
        if( aData[hdr+7]>57 ) return 0;

        /* Remove the slot from the free-list. Update the number of
        ** fragmented bytes within the page. */
        memcpy(&aData[iAddr], &aData[pc], 2);
        aData[hdr+7] += (u8)x;
        return &aData[pc];
      }else if( x+pc > maxPC ){
        /* This slot extends off the end of the usable part of the page */
        *pRc = SQLITE_CORRUPT_PAGE(pPg);
        return 0;
      }else{
        /* The slot remains on the free-list. Reduce its size to account
        ** for the portion used by the new allocation. */
        put2byte(&aData[pc+2], x);
      }
      return &aData[pc + x];
    }
    iAddr = pc;
    pTmp = &aData[pc];
    pc = get2byte(pTmp);
    if( pc<=iAddr ){
      if( pc ){
        /* The next slot in the chain comes before the current slot */
        *pRc = SQLITE_CORRUPT_PAGE(pPg);
      }
      return 0;
    }
  }
  if( pc>maxPC+nByte-4 ){
    /* The free slot chain extends off the end of the page */
    *pRc = SQLITE_CORRUPT_PAGE(pPg);
  }
  return 0;
}